

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void __thiscall
icu_63::TextTrieMap::search
          (TextTrieMap *this,CharacterNode *node,UnicodeString *text,int32_t start,int32_t index,
          TextTrieMapSearchResultHandler *handler,UErrorCode *status)

{
  UBool UVar1;
  char16_t cVar2;
  int iVar3;
  int32_t iVar4;
  int local_88;
  UChar c_1;
  UChar c;
  int32_t tmpidx;
  undefined1 local_78 [8];
  UnicodeString tmp;
  UChar32 c32;
  TextTrieMapSearchResultHandler *handler_local;
  int32_t index_local;
  int32_t start_local;
  UnicodeString *text_local;
  CharacterNode *node_local;
  TextTrieMap *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if ((UVar1 == '\0') &&
     ((UVar1 = CharacterNode::hasValues(node), UVar1 == '\0' ||
      ((iVar3 = (**handler->_vptr_TextTrieMapSearchResultHandler)
                          (handler,(ulong)(uint)(index - start),node,status), (char)iVar3 != '\0' &&
       (UVar1 = ::U_FAILURE(*status), UVar1 == '\0')))))) {
    if (this->fIgnoreCase == '\0') {
      handler_local._0_4_ = index + 1;
      cVar2 = UnicodeString::charAt(text,index);
      text_local = (UnicodeString *)getChildNode(this,node,cVar2);
    }
    else {
      tmp.fUnion._52_4_ = UnicodeString::char32At(text,index);
      handler_local._0_4_ = (index - (uint)((uint)tmp.fUnion._52_4_ < 0x10000)) + 2;
      UnicodeString::UnicodeString((UnicodeString *)local_78,tmp.fUnion._52_4_);
      UnicodeString::foldCase((UnicodeString *)local_78,0);
      local_88 = 0;
      text_local = (UnicodeString *)node;
      do {
        iVar4 = UnicodeString::length((UnicodeString *)local_78);
        if (iVar4 <= local_88) break;
        cVar2 = UnicodeString::charAt((UnicodeString *)local_78,local_88);
        text_local = (UnicodeString *)getChildNode(this,(CharacterNode *)text_local,cVar2);
        local_88 = local_88 + 1;
      } while (text_local != (UnicodeString *)0x0);
      UnicodeString::~UnicodeString((UnicodeString *)local_78);
    }
    if (text_local != (UnicodeString *)0x0) {
      search(this,(CharacterNode *)text_local,text,start,(int)handler_local,handler,status);
    }
  }
  return;
}

Assistant:

void
TextTrieMap::search(CharacterNode *node, const UnicodeString &text, int32_t start,
                  int32_t index, TextTrieMapSearchResultHandler *handler, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return;
    }
    if (node->hasValues()) {
        if (!handler->handleMatch(index - start, node, status)) {
            return;
        }
        if (U_FAILURE(status)) {
            return;
        }
    }
    if (fIgnoreCase) {
        // for folding we need to get a complete code point.
        // size of character may grow after fold operation;
        // then we need to get result as UTF16 code units.
        UChar32 c32 = text.char32At(index);
        index += U16_LENGTH(c32);
        UnicodeString tmp(c32);
        tmp.foldCase();
        int32_t tmpidx = 0;
        while (tmpidx < tmp.length()) {
            UChar c = tmp.charAt(tmpidx++);
            node = getChildNode(node, c);
            if (node == NULL) {
                break;
            }
        }
    } else {
        // here we just get the next UTF16 code unit
        UChar c = text.charAt(index++);
        node = getChildNode(node, c);
    }
    if (node != NULL) {
        search(node, text, start, index, handler, status);
    }
}